

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

ExpNode * __thiscall Parser::ExprAssignAUX(Parser *this,ExpNode *expr)

{
  uint uVar1;
  ExpNode *exp2;
  AssignNode *this_00;
  
  if (this->tok == 0x10) {
    Eat(this,0x10);
    exp2 = ExprAssign(this);
    expr->lValue = true;
    this_00 = (AssignNode *)operator_new(0x48);
    AssignNode::AssignNode(this_00,expr,exp2);
    uVar1 = lexical_analyzer_getLine();
    (*(this_00->super_ExpNode).super_StmtNode.super_ASTNode._vptr_ASTNode[2])(this_00,(ulong)uVar1);
    expr = (ExpNode *)this_00;
  }
  return &((AssignNode *)expr)->super_ExpNode;
}

Assistant:

ExpNode *Parser::ExprAssignAUX(ExpNode *expr) {
    ExpNode *exp2 = nullptr;
    ExpNode *node = expr;
    switch (tok) {
        case ASSIGN: {
            Eat(ASSIGN);
            exp2 = ExprAssign();

            expr->setLValue(true);
            node = new AssignNode(expr, exp2);
            node->setLine(lexical_analyzer_getLine());

            break;
        }
    }
    return node;
}